

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vector.h
# Opt level: O0

void __thiscall sc_core::sc_vector_base::~sc_vector_base(sc_vector_base *this)

{
  void *pvVar1;
  undefined8 *in_RDI;
  vector<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_> *unaff_retaddr;
  sc_object *in_stack_fffffffffffffff0;
  
  *in_RDI = &PTR_print_00366e40;
  pvVar1 = (void *)in_RDI[0x11];
  if (pvVar1 != (void *)0x0) {
    std::vector<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>::~vector(unaff_retaddr)
    ;
    operator_delete(pvVar1);
  }
  std::vector<sc_core::sc_vector_element_*,_std::allocator<sc_core::sc_vector_element_*>_>::~vector
            ((vector<sc_core::sc_vector_element_*,_std::allocator<sc_core::sc_vector_element_*>_> *)
             unaff_retaddr);
  sc_object::~sc_object(in_stack_fffffffffffffff0);
  return;
}

Assistant:

~sc_vector_base()
    { delete objs_vec_; }